

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingNegativeCase::iterate
          (LayoutBindingNegativeCase *this)

{
  TestContext *this_00;
  ProgramInfo *pPVar1;
  ShaderInfo *pSVar2;
  char *description;
  string local_38 [8];
  string failMessage;
  bool pass;
  LayoutBindingNegativeCase *this_local;
  
  failMessage.field_2._M_local_buf[0xf] = '\0';
  std::__cxx11::string::string(local_38);
  if (this->m_errorType < ERRORTYPE_CONTRADICTORY) {
    if ((this->m_tessSupport & 1U) == 0) {
      pSVar2 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_VERTEX,0);
      if (((pSVar2->compileOk & 1U) == 0) ||
         (pSVar2 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_FRAGMENT,0),
         (pSVar2->compileOk & 1U) == 0)) {
        failMessage.field_2._M_local_buf[0xf] = '\x01';
      }
    }
    else {
      pSVar2 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_VERTEX,0);
      if (((((pSVar2->compileOk & 1U) == 0) ||
           (pSVar2 = glu::ShaderProgram::getShaderInfo(this->m_program,SHADERTYPE_FRAGMENT,0),
           (pSVar2->compileOk & 1U) == 0)) ||
          (pSVar2 = glu::ShaderProgram::getShaderInfo
                              (this->m_program,SHADERTYPE_TESSELLATION_CONTROL,0),
          (pSVar2->compileOk & 1U) == 0)) ||
         (pSVar2 = glu::ShaderProgram::getShaderInfo
                             (this->m_program,SHADERTYPE_TESSELLATION_EVALUATION,0),
         (pSVar2->compileOk & 1U) == 0)) {
        failMessage.field_2._M_local_buf[0xf] = '\x01';
      }
    }
    std::__cxx11::string::operator=(local_38,"Test failed - expected a compile-time error");
  }
  else if (this->m_errorType == ERRORTYPE_CONTRADICTORY) {
    pPVar1 = glu::ShaderProgram::getProgramInfo(this->m_program);
    if ((pPVar1->linkOk & 1U) == 0) {
      failMessage.field_2._M_local_buf[0xf] = '\x01';
    }
    std::__cxx11::string::operator=(local_38,"Test failed - expected a link-time error");
  }
  if ((failMessage.field_2._M_local_buf[0xf] & 1U) == 0) {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = (char *)std::__cxx11::string::c_str();
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_FAIL,description);
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  std::__cxx11::string::~string(local_38);
  return STOP;
}

Assistant:

TestCase::IterateResult LayoutBindingNegativeCase::iterate (void)
{
	bool pass = false;
	std::string failMessage;

	switch (m_errorType)
	{
		case ERRORTYPE_CONTRADICTORY:		// Contradictory binding points should cause a link-time error
			if (!(m_program->getProgramInfo()).linkOk)
				pass = true;
			failMessage = "Test failed - expected a link-time error";
			break;

		case ERRORTYPE_LESS_THAN_ZERO:		// Out of bounds binding points should cause a compile-time error
		case ERRORTYPE_OVER_MAX_UNITS:
			if (m_tessSupport)
			{
				if (!(m_program->getShaderInfo(glu::SHADERTYPE_VERTEX)).compileOk
					|| !(m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk)
					|| !(m_program->getShaderInfo(glu::SHADERTYPE_TESSELLATION_CONTROL).compileOk)
					|| !(m_program->getShaderInfo(glu::SHADERTYPE_TESSELLATION_EVALUATION)).compileOk)
					pass = true;
			}
			else
			{
				if (!(m_program->getShaderInfo(glu::SHADERTYPE_VERTEX)).compileOk
					|| !(m_program->getShaderInfo(glu::SHADERTYPE_FRAGMENT).compileOk))
					pass = true;
			}

			failMessage = "Test failed - expected a compile-time error";
			break;

		default:
			DE_ASSERT(false);
	}

	if (pass)
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	else
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, failMessage.c_str());

	return STOP;
}